

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_misc.cpp
# Opt level: O1

void __thiscall
amrex::MLNodeLaplacian::updateVelocity
          (MLNodeLaplacian *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *vel,
          Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *sol)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  MLNodeLaplacian *pMVar15;
  FabType FVar16;
  uint uVar17;
  long lVar18;
  int *piVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  int iVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  void *__s;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  bool bVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  Real facz;
  Real facy;
  Real facx;
  MFIter mfi;
  long local_338;
  long local_318;
  Box local_2e4;
  long local_2c8;
  double *local_2c0;
  int local_2b4;
  long local_2b0;
  int local_2a8;
  uint local_2a4;
  int local_2a0;
  int local_29c;
  int local_298;
  int local_294;
  Array4<double> local_290;
  MLNodeLaplacian *local_250;
  double local_248;
  double local_240;
  FabArray<amrex::FArrayBox> *local_238;
  FabArray<amrex::EBCellFlagFab> *local_230;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_228;
  long *local_220;
  long local_218;
  ulong local_210;
  long local_208;
  double local_200;
  Array4<const_double> local_1f8;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> local_188;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *local_180;
  long local_178;
  long local_170;
  ulong local_168;
  long local_160;
  long local_158;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  if (0 < (this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels) {
    lVar20 = 0;
    local_250 = this;
    local_228 = vel;
    local_180 = sol;
    do {
      pMVar15 = local_250;
      local_220 = *(long **)&(local_250->m_sigma).
                             super_vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                             .
                             super__Vector_base<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar20].
                             super_vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                             .
                             super__Vector_base<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
      ;
      lVar18 = *(long *)&(local_250->super_MLNodeLinOp).super_MLLinOp.m_geom.
                         super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar20].
                         super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                         super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
      local_240 = *(double *)(lVar18 + 0x38);
      local_248 = *(double *)(lVar18 + 0x40);
      local_200 = *(double *)(lVar18 + 0x48);
      lVar18 = **(long **)&(local_250->super_MLNodeLinOp).super_MLLinOp.m_factory.
                           super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar20].
                           super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                           .
                           super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
      ;
      if (lVar18 == 0) {
        lVar18 = 0;
      }
      else {
        lVar18 = __dynamic_cast(lVar18,&FabFactory<amrex::FArrayBox>::typeinfo,
                                &EBFArrayBoxFactory::typeinfo,0);
      }
      if (lVar18 == 0) {
        local_230 = (FabArray<amrex::EBCellFlagFab> *)0x0;
        local_238 = (FabArray<amrex::FArrayBox> *)0x0;
        local_170 = lVar18;
      }
      else {
        local_230 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar18 + 0xd8));
        local_170 = lVar18;
        local_238 = &EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar18 + 0xd8))->
                     super_FabArray<amrex::FArrayBox>;
      }
      local_188._M_t.
      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
           (pMVar15->m_integral).
           super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar20]._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
      MFIter::MFIter(&local_90,
                     (FabArrayBase *)
                     (local_228->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                     ).super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar20],true);
      if (local_90.currentIndex < local_90.endIndex) {
        local_190 = local_240 * 0.25;
        local_198 = local_248 * 0.25;
        local_1a0 = local_200 * 0.25;
        local_1a8 = local_240 * -0.25;
        local_1b0 = local_248 * -0.25;
        local_1b8 = local_200 * -0.25;
        local_178 = lVar20;
        do {
          lVar20 = local_178;
          MFIter::tilebox(&local_2e4,&local_90);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_290,
                     &(local_228->
                      super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar20]->
                      super_FabArray<amrex::FArrayBox>,&local_90);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_1f8,
                     &(local_180->
                      super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                      ).
                      super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar20]->
                      super_FabArray<amrex::FArrayBox>,&local_90);
          bVar44 = lVar18 == 0;
          if (local_170 != 0) {
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_150,(FabArray<amrex::FArrayBox> *)*local_220,&local_90);
            piVar19 = &local_90.currentIndex;
            if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
              piVar19 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + local_90.currentIndex;
            }
            FVar16 = EBCellFlagFab::getType
                               ((local_230->m_fabs_v).
                                super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[*piVar19],&local_2e4);
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_d0,local_238,&local_90);
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_110,
                       (FabArray<amrex::FArrayBox> *)
                       local_188._M_t.
                       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                       .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&local_90);
            iVar14 = local_2e4.bigend.vect[2];
            iVar13 = local_2e4.bigend.vect[1];
            iVar12 = local_2e4.bigend.vect[0];
            iVar11 = local_2e4.smallend.vect[2];
            iVar10 = local_2e4.smallend.vect[1];
            iVar33 = local_2e4.smallend.vect[0];
            if (FVar16 == singlevalued) {
              local_2a4 = local_2e4.bigend.vect[2];
              if (local_2e4.smallend.vect[2] <= local_2e4.bigend.vect[2]) {
                local_168 = (ulong)(uint)local_2e4.bigend.vect[1];
                local_218 = (long)local_2e4.smallend.vect[1];
                local_160 = (long)local_2e4.smallend.vect[0];
                local_298 = local_2e4.bigend.vect[1] + 1;
                local_2a0 = local_2e4.smallend.vect[0] + 1;
                local_2c8 = local_160 * 8;
                local_2b4 = local_2e4.smallend.vect[2] + 1;
                local_2a8 = local_2e4.smallend.vect[1] + 1;
                local_294 = local_2e4.bigend.vect[0];
                uVar17 = local_2e4.smallend.vect[2];
                do {
                  local_210 = (ulong)uVar17;
                  if (local_2e4.smallend.vect[1] <= local_2e4.bigend.vect[1]) {
                    local_208 = (long)(int)uVar17;
                    local_29c = uVar17 + 1;
                    local_158 = local_d0.jstride * 8;
                    lVar20 = (long)local_d0.p +
                             (local_218 - local_d0.begin.y) * local_158 +
                             (local_208 - local_d0.begin.z) * local_d0.kstride * 8 +
                             (long)local_d0.begin.x * -8 + local_2c8;
                    local_2b0 = CONCAT44(local_2b0._4_4_,local_2a8);
                    local_318 = local_218;
                    do {
                      if (local_2e4.smallend.vect[0] <= local_2e4.bigend.vect[0]) {
                        lVar21 = (long)local_1f8.begin.x;
                        lVar26 = (int)(uVar17 - local_1f8.begin.z) * local_1f8.kstride;
                        lVar35 = (long)local_290.begin.x;
                        lVar38 = (local_318 - local_290.begin.y) * local_290.jstride;
                        lVar23 = (local_208 - local_290.begin.z) * local_290.kstride;
                        lVar30 = (local_318 - local_150.begin.y) * local_150.jstride;
                        lVar41 = (local_208 - local_150.begin.z) * local_150.kstride;
                        lVar27 = (long)local_150.begin.x;
                        lVar39 = (local_29c - local_1f8.begin.z) * local_1f8.kstride;
                        lVar29 = (long)(local_2b4 - local_1f8.begin.z) * local_1f8.kstride * 8;
                        lVar42 = (local_208 - local_1f8.begin.z) * local_1f8.kstride * 8;
                        lVar25 = local_1f8.jstride * (local_318 - local_1f8.begin.y);
                        lVar40 = (((int)local_318 - local_1f8.begin.y) + 1) * local_1f8.jstride;
                        lVar43 = (local_318 - local_1f8.begin.y) * local_1f8.jstride * 8;
                        lVar32 = (long)((int)local_2b0 - local_1f8.begin.y) * local_1f8.jstride * 8;
                        lVar22 = (local_318 - local_110.begin.y) * local_110.jstride;
                        lVar37 = (local_208 - local_110.begin.z) * local_110.kstride;
                        lVar31 = (long)local_110.begin.x;
                        local_2c0 = local_110.p +
                                    local_160 + ((lVar22 + lVar37 + local_110.nstride * 7) - lVar31)
                        ;
                        lVar34 = 0;
                        do {
                          dVar47 = *(double *)(lVar20 + lVar34 * 8);
                          if ((dVar47 != 0.0) || (NAN(dVar47))) {
                            lVar36 = (long)((local_2a0 - local_1f8.begin.x) + (int)lVar34);
                            dVar1 = local_1f8.p[lVar25 + lVar36 + lVar26];
                            dVar2 = local_1f8.p[lVar25 + lVar36 + lVar39];
                            dVar3 = local_1f8.p[lVar40 + lVar36 + lVar26];
                            dVar4 = local_1f8.p[lVar40 + lVar36 + lVar39];
                            dVar5 = *(double *)
                                     ((long)local_1f8.p +
                                     lVar34 * 8 + lVar43 + lVar42 + lVar21 * -8 + local_2c8);
                            dVar6 = *(double *)
                                     ((long)local_1f8.p +
                                     lVar34 * 8 + lVar32 + lVar42 + lVar21 * -8 + local_2c8);
                            dVar7 = *(double *)
                                     ((long)local_1f8.p +
                                     lVar34 * 8 + lVar43 + lVar29 + lVar21 * -8 + local_2c8);
                            dVar8 = *(double *)
                                     ((long)local_1f8.p +
                                     lVar34 * 8 + lVar29 + lVar32 + lVar21 * -8 + local_2c8);
                            dVar46 = ((dVar4 - dVar8) - dVar2) + dVar7;
                            dVar49 = ((((dVar3 + dVar46) - dVar6) - dVar1) + dVar5) / dVar47;
                            dVar48 = ((((((dVar2 + (dVar4 - dVar8)) - dVar7) - dVar3) + dVar6) -
                                      dVar1) + dVar5) / dVar47;
                            dVar45 = ((((((dVar8 + dVar4) - dVar2) - dVar7) - dVar3) - dVar6) +
                                      dVar1 + dVar5) / dVar47;
                            dVar47 = (((dVar46 - dVar3) + dVar6 + dVar1) - dVar5) / dVar47;
                            local_290.p[local_160 + ((lVar38 + lVar23 + lVar34) - lVar35)] =
                                 local_290.p[local_160 + ((lVar38 + lVar23 + lVar34) - lVar35)] -
                                 local_150.p[local_160 + ((lVar30 + lVar41 + lVar34) - lVar27)] *
                                 local_240 *
                                 (local_110.p
                                  [local_160 +
                                   ((lVar22 + lVar37 + local_110.nstride * 8 + lVar34) - lVar31)] *
                                  dVar47 + local_110.p
                                           [local_160 +
                                            ((lVar22 + lVar37 + local_110.nstride * 2 + lVar34) -
                                            lVar31)] * 0.5 * dVar48 +
                                           local_110.p
                                           [local_160 +
                                            ((local_110.nstride + lVar22 + lVar37 + lVar34) - lVar31
                                            )] * 0.5 * dVar49 +
                                           (((((((dVar1 - dVar5) - dVar6) + dVar3) - dVar7) + dVar2)
                                            - dVar8) + dVar4) * 0.25);
                            local_290.p
                            [local_160 + ((local_290.nstride + lVar38 + lVar23 + lVar34) - lVar35)]
                                 = local_290.p
                                   [local_160 +
                                    ((local_290.nstride + lVar38 + lVar23 + lVar34) - lVar35)] -
                                   local_150.p[local_160 + ((lVar30 + lVar41 + lVar34) - lVar27)] *
                                   local_248 *
                                   (local_2c0[lVar34] * dVar47 +
                                   local_110.p
                                   [local_160 +
                                    ((lVar22 + lVar37 + local_110.nstride * 2 + lVar34) - lVar31)] *
                                   0.5 * dVar45 +
                                   local_110.p[local_160 + ((lVar22 + lVar37 + lVar34) - lVar31)] *
                                   0.5 * dVar49 +
                                   (((((-dVar5 - dVar1) + dVar6 + dVar3) - dVar7) - dVar2) + dVar8 +
                                   dVar4) * 0.25);
                            local_290.p
                            [local_160 +
                             ((lVar38 + lVar23 + local_290.nstride * 2 + lVar34) - lVar35)] =
                                 local_290.p
                                 [local_160 +
                                  ((lVar38 + lVar23 + local_290.nstride * 2 + lVar34) - lVar35)] -
                                 local_150.p[local_160 + ((lVar30 + lVar41 + lVar34) - lVar27)] *
                                 local_200 *
                                 (dVar47 * local_110.p
                                           [local_160 +
                                            ((lVar22 + lVar37 + local_110.nstride * 6 + lVar34) -
                                            lVar31)] +
                                 local_110.p
                                 [local_160 +
                                  ((local_110.nstride + lVar22 + lVar37 + lVar34) - lVar31)] * 0.5 *
                                 dVar45 + local_110.p
                                          [local_160 + ((lVar22 + lVar37 + lVar34) - lVar31)] * 0.5
                                          * dVar48 +
                                          ((((-dVar5 - dVar1) - dVar6) - dVar3) + dVar7 + dVar2 +
                                           dVar8 + dVar4) * 0.25);
                          }
                          else {
                            local_290.p
                            [local_160 +
                             ((lVar38 + lVar23 + local_290.nstride * 2 + lVar34) - lVar35)] = 0.0;
                            local_290.p
                            [local_160 + ((local_290.nstride + lVar38 + lVar23 + lVar34) - lVar35)]
                                 = 0.0;
                            local_290.p[local_160 + ((lVar38 + lVar23 + lVar34) - lVar35)] = 0.0;
                          }
                          lVar34 = lVar34 + 1;
                        } while ((local_2e4.bigend.vect[0] - local_2e4.smallend.vect[0]) + 1 !=
                                 (int)lVar34);
                      }
                      local_318 = local_318 + 1;
                      local_2b0 = CONCAT44(local_2b0._4_4_,(int)local_2b0 + 1);
                      lVar20 = lVar20 + local_158;
                    } while (local_298 != (int)local_318);
                  }
                  local_2b4 = local_2b4 + 1;
                  bVar44 = uVar17 != local_2e4.bigend.vect[2];
                  uVar17 = uVar17 + 1;
                } while (bVar44);
              }
            }
            else {
              bVar44 = true;
              if (FVar16 != covered) goto LAB_005fb451;
              lVar26 = (long)local_2e4.smallend.vect[0];
              lVar21 = (long)local_2e4.smallend.vect[1];
              uVar17 = local_2e4.bigend.vect[0] - local_2e4.smallend.vect[0];
              iVar24 = local_2e4.bigend.vect[1] - local_2e4.smallend.vect[1];
              local_338 = 0;
              lVar20 = 0;
              do {
                uVar9 = iVar11;
                if (iVar11 <= iVar14) {
                  do {
                    if (iVar10 <= iVar13) {
                      lVar40 = local_290.jstride * 8;
                      __s = (void *)((long)local_290.p +
                                    local_290.nstride * local_338 +
                                    (lVar21 - local_290.begin.y) * lVar40 +
                                    (int)(uVar9 - local_290.begin.z) * local_290.kstride * 8 +
                                    (long)local_290.begin.x * -8 + lVar26 * 8);
                      iVar28 = iVar24 + 1;
                      do {
                        if (iVar33 <= iVar12) {
                          memset(__s,0,(ulong)uVar17 * 8 + 8);
                        }
                        __s = (void *)((long)__s + lVar40);
                        iVar28 = iVar28 + -1;
                      } while (iVar28 != 0);
                    }
                    bVar44 = uVar9 != iVar14;
                    uVar9 = uVar9 + 1;
                  } while (bVar44);
                }
                lVar20 = lVar20 + 1;
                local_338 = local_338 + 8;
              } while (lVar20 != 3);
            }
            bVar44 = false;
          }
LAB_005fb451:
          if (bVar44) {
            if (*local_220 == 0) {
              if (local_2e4.smallend.vect[2] <= local_2e4.bigend.vect[2]) {
                lVar20 = (long)local_2e4.smallend.vect[1];
                dVar47 = local_250->m_const_sigma;
                local_2c0 = (double *)((long)local_2e4.smallend.vect[0] * 8);
                uVar17 = local_2e4.smallend.vect[2];
                uVar9 = local_2e4.smallend.vect[2];
                do {
                  uVar9 = uVar9 + 1;
                  if (local_2e4.smallend.vect[1] <= local_2e4.bigend.vect[1]) {
                    lVar27 = (long)local_1f8.begin.x;
                    lVar26 = (long)local_290.begin.x;
                    lVar37 = local_290.jstride * 8;
                    lVar21 = (lVar20 - local_290.begin.y) * lVar37 +
                             ((long)(int)uVar17 - (long)local_290.begin.z) * local_290.kstride * 8;
                    lVar25 = (long)local_290.p + lVar21 + lVar26 * -8 + (long)local_2c0;
                    lVar22 = (long)local_290.p +
                             lVar21 + local_290.nstride * 8 + lVar26 * -8 + (long)local_2c0;
                    lVar23 = (long)local_290.p +
                             local_290.nstride * 0x10 + lVar21 + lVar26 * -8 + (long)local_2c0;
                    lVar34 = local_1f8.jstride * 8;
                    lVar21 = (lVar20 - local_1f8.begin.y) * lVar34;
                    lVar26 = (long)(int)(uVar9 - local_1f8.begin.z) * local_1f8.kstride * 8;
                    lVar31 = ((long)(int)uVar17 - (long)local_1f8.begin.z) * local_1f8.kstride * 8;
                    iVar33 = (local_2e4.smallend.vect[1] + 1) - local_1f8.begin.y;
                    lVar29 = (long)local_1f8.p + (long)local_2c0 + lVar21 + lVar26 + lVar27 * -8 + 8
                    ;
                    lVar40 = (long)local_1f8.p + (long)local_2c0 + lVar21 + lVar31 + lVar27 * -8 + 8
                    ;
                    lVar21 = lVar20;
                    do {
                      if (local_2e4.smallend.vect[0] <= local_2e4.bigend.vect[0]) {
                        lVar39 = iVar33 * lVar34 + lVar26 + lVar27 * -8;
                        lVar43 = iVar33 * lVar34 + lVar31 + lVar27 * -8;
                        lVar32 = 0;
                        do {
                          *(double *)(lVar25 + lVar32 * 8) =
                               (((((((*(double *)(lVar40 + lVar32 * 8) -
                                     *(double *)(lVar40 + -8 + lVar32 * 8)) -
                                    *(double *)
                                     ((long)local_1f8.p + (long)local_2c0 + lVar32 * 8 + lVar43)) +
                                   *(double *)
                                    ((long)local_1f8.p + (long)local_2c0 + lVar32 * 8 + lVar43 + 8))
                                  - *(double *)(lVar29 + -8 + lVar32 * 8)) +
                                 *(double *)(lVar29 + lVar32 * 8)) -
                                *(double *)
                                 ((long)local_1f8.p + (long)local_2c0 + lVar32 * 8 + lVar39)) +
                               *(double *)
                                ((long)local_1f8.p + (long)local_2c0 + lVar32 * 8 + lVar39 + 8)) *
                               local_1a8 * dVar47 + *(double *)(lVar25 + lVar32 * 8);
                          *(double *)(lVar22 + lVar32 * 8) =
                               (((((-*(double *)(lVar40 + -8 + lVar32 * 8) -
                                   *(double *)(lVar40 + lVar32 * 8)) +
                                   *(double *)
                                    ((long)local_1f8.p + (long)local_2c0 + lVar32 * 8 + lVar43) +
                                  *(double *)
                                   ((long)local_1f8.p + (long)local_2c0 + lVar32 * 8 + lVar43 + 8))
                                 - *(double *)(lVar29 + -8 + lVar32 * 8)) -
                                *(double *)(lVar29 + lVar32 * 8)) +
                                *(double *)
                                 ((long)local_1f8.p + (long)local_2c0 + lVar32 * 8 + lVar39) +
                               *(double *)
                                ((long)local_1f8.p + (long)local_2c0 + lVar32 * 8 + lVar39 + 8)) *
                               local_1b0 * dVar47 + *(double *)(lVar22 + lVar32 * 8);
                          *(double *)(lVar23 + lVar32 * 8) =
                               ((((-*(double *)(lVar40 + -8 + lVar32 * 8) -
                                  *(double *)(lVar40 + lVar32 * 8)) -
                                 *(double *)
                                  ((long)local_1f8.p + (long)local_2c0 + lVar32 * 8 + lVar43)) -
                                *(double *)
                                 ((long)local_1f8.p + (long)local_2c0 + lVar32 * 8 + lVar43 + 8)) +
                                *(double *)(lVar29 + -8 + lVar32 * 8) +
                                *(double *)(lVar29 + lVar32 * 8) +
                                *(double *)
                                 ((long)local_1f8.p + (long)local_2c0 + lVar32 * 8 + lVar39) +
                               *(double *)
                                ((long)local_1f8.p + (long)local_2c0 + lVar32 * 8 + lVar39 + 8)) *
                               dVar47 * local_1b8 + *(double *)(lVar23 + lVar32 * 8);
                          lVar32 = lVar32 + 1;
                        } while ((local_2e4.bigend.vect[0] - local_2e4.smallend.vect[0]) + 1 !=
                                 (int)lVar32);
                      }
                      lVar21 = lVar21 + 1;
                      lVar25 = lVar25 + lVar37;
                      lVar22 = lVar22 + lVar37;
                      lVar23 = lVar23 + lVar37;
                      lVar29 = lVar29 + lVar34;
                      lVar40 = lVar40 + lVar34;
                      iVar33 = iVar33 + 1;
                    } while (local_2e4.bigend.vect[1] + 1U != (int)lVar21);
                  }
                  bVar44 = uVar17 != local_2e4.bigend.vect[2];
                  uVar17 = uVar17 + 1;
                } while (bVar44);
              }
            }
            else {
              FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                        (&local_150,(FabArray<amrex::FArrayBox> *)*local_220,&local_90);
              if (local_2e4.smallend.vect[2] <= local_2e4.bigend.vect[2]) {
                local_2c0 = (double *)(ulong)(uint)local_2e4.bigend.vect[1];
                lVar21 = (long)local_2e4.smallend.vect[1];
                lVar20 = (long)local_2e4.smallend.vect[0] * 8;
                local_2c8 = CONCAT44(local_2c8._4_4_,local_2e4.smallend.vect[1] + 1);
                uVar17 = local_2e4.smallend.vect[2];
                uVar9 = local_2e4.smallend.vect[2];
                do {
                  uVar9 = uVar9 + 1;
                  if (local_2e4.smallend.vect[1] <= local_2e4.bigend.vect[1]) {
                    lVar25 = (long)(int)uVar17;
                    local_2b0 = (long)local_150.begin.y;
                    lVar22 = (long)local_1f8.begin.x;
                    lVar40 = (long)local_290.begin.x;
                    lVar37 = local_290.jstride * 8;
                    lVar26 = (lVar21 - local_290.begin.y) * lVar37 +
                             (lVar25 - local_290.begin.z) * local_290.kstride * 8;
                    lVar27 = (long)local_290.p + lVar26 + lVar40 * -8 + lVar20;
                    lVar29 = (long)local_290.p +
                             lVar26 + local_290.nstride * 8 + lVar40 * -8 + lVar20;
                    lVar39 = (long)local_290.p +
                             local_290.nstride * 0x10 + lVar26 + lVar40 * -8 + lVar20;
                    lVar43 = local_1f8.jstride * 8;
                    lVar26 = (lVar21 - local_1f8.begin.y) * lVar43;
                    lVar40 = (long)(int)(uVar9 - local_1f8.begin.z) * local_1f8.kstride * 8;
                    lVar34 = (lVar25 - local_1f8.begin.z) * local_1f8.kstride * 8;
                    iVar33 = (local_2e4.smallend.vect[1] + 1) - local_1f8.begin.y;
                    lVar31 = (long)local_1f8.p + lVar26 + lVar40 + lVar22 * -8 + lVar20 + 8;
                    lVar23 = (long)local_1f8.p + lVar26 + lVar34 + lVar22 * -8 + lVar20 + 8;
                    lVar25 = (long)local_150.p +
                             (lVar21 - local_2b0) * local_150.jstride * 8 +
                             (lVar25 - local_150.begin.z) * local_150.kstride * 8 +
                             (long)local_150.begin.x * -8 + lVar20;
                    lVar26 = lVar21;
                    do {
                      if (local_2e4.smallend.vect[0] <= local_2e4.bigend.vect[0]) {
                        lVar32 = iVar33 * lVar43 + lVar40 + lVar22 * -8 + lVar20;
                        lVar35 = iVar33 * lVar43 + lVar34 + lVar22 * -8 + lVar20;
                        lVar30 = 0;
                        do {
                          *(double *)(lVar27 + lVar30 * 8) =
                               *(double *)(lVar27 + lVar30 * 8) -
                               *(double *)(lVar25 + lVar30 * 8) * local_190 *
                               (((((((*(double *)(lVar23 + lVar30 * 8) -
                                     *(double *)(lVar23 + -8 + lVar30 * 8)) -
                                    *(double *)((long)local_1f8.p + lVar30 * 8 + lVar35)) +
                                   *(double *)((long)local_1f8.p + lVar30 * 8 + lVar35 + 8)) -
                                  *(double *)(lVar31 + -8 + lVar30 * 8)) +
                                 *(double *)(lVar31 + lVar30 * 8)) -
                                *(double *)((long)local_1f8.p + lVar30 * 8 + lVar32)) +
                               *(double *)((long)local_1f8.p + lVar30 * 8 + lVar32 + 8));
                          *(double *)(lVar29 + lVar30 * 8) =
                               *(double *)(lVar29 + lVar30 * 8) -
                               *(double *)(lVar25 + lVar30 * 8) * local_198 *
                               (((((-*(double *)(lVar23 + -8 + lVar30 * 8) -
                                   *(double *)(lVar23 + lVar30 * 8)) +
                                   *(double *)((long)local_1f8.p + lVar30 * 8 + lVar35) +
                                  *(double *)((long)local_1f8.p + lVar30 * 8 + lVar35 + 8)) -
                                 *(double *)(lVar31 + -8 + lVar30 * 8)) -
                                *(double *)(lVar31 + lVar30 * 8)) +
                                *(double *)((long)local_1f8.p + lVar30 * 8 + lVar32) +
                               *(double *)((long)local_1f8.p + lVar30 * 8 + lVar32 + 8));
                          *(double *)(lVar39 + lVar30 * 8) =
                               *(double *)(lVar39 + lVar30 * 8) -
                               *(double *)(lVar25 + lVar30 * 8) * local_1a0 *
                               ((((-*(double *)(lVar23 + -8 + lVar30 * 8) -
                                  *(double *)(lVar23 + lVar30 * 8)) -
                                 *(double *)((long)local_1f8.p + lVar30 * 8 + lVar35)) -
                                *(double *)((long)local_1f8.p + lVar30 * 8 + lVar35 + 8)) +
                                *(double *)(lVar31 + -8 + lVar30 * 8) +
                                *(double *)(lVar31 + lVar30 * 8) +
                                *(double *)((long)local_1f8.p + lVar30 * 8 + lVar32) +
                               *(double *)((long)local_1f8.p + lVar30 * 8 + lVar32 + 8));
                          lVar30 = lVar30 + 1;
                        } while ((local_2e4.bigend.vect[0] - local_2e4.smallend.vect[0]) + 1 !=
                                 (int)lVar30);
                      }
                      lVar26 = lVar26 + 1;
                      lVar27 = lVar27 + lVar37;
                      lVar29 = lVar29 + lVar37;
                      lVar39 = lVar39 + lVar37;
                      lVar31 = lVar31 + lVar43;
                      lVar23 = lVar23 + lVar43;
                      iVar33 = iVar33 + 1;
                      lVar25 = lVar25 + local_150.jstride * 8;
                    } while (local_2e4.bigend.vect[1] + 1U != (int)lVar26);
                  }
                  bVar44 = uVar17 != local_2e4.bigend.vect[2];
                  uVar17 = uVar17 + 1;
                } while (bVar44);
              }
            }
          }
          MFIter::operator++(&local_90);
          lVar20 = local_178;
        } while (local_90.currentIndex < local_90.endIndex);
      }
      MFIter::~MFIter(&local_90);
      lVar20 = lVar20 + 1;
    } while (lVar20 < (local_250->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels);
  }
  return;
}

Assistant:

void
MLNodeLaplacian::updateVelocity (const Vector<MultiFab*>& vel, const Vector<MultiFab const*>& sol) const
{
#if (AMREX_SPACEDIM == 2)
    bool is_rz = m_is_rz;
#endif

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        const auto& sigma = m_sigma[amrlev][0][0];
        const auto dxinv = m_geom[amrlev][0].InvCellSizeArray();
#ifdef AMREX_USE_EB
        auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][0].get());
        const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
        const MultiFab* vfrac = (factory) ? &(factory->getVolFrac()) : nullptr;
        const MultiFab* intg = m_integral[amrlev].get();
#endif
        for (MFIter mfi(*vel[amrlev], TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            Array4<Real> const& varr = vel[amrlev]->array(mfi);
            Array4<Real const> const& solarr = sol[amrlev]->const_array(mfi);
#ifdef AMREX_USE_EB
            bool regular = !factory;
            if (factory)
            {
                Array4<Real const> const& sigmaarr = sigma->const_array(mfi);
                auto type = (*flags)[mfi].getType(bx);
                Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                Array4<Real const> const& intgarr = intg->const_array(mfi);
                if (type == FabType::covered)
                {
                    AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, AMREX_SPACEDIM, i, j, k, n,
                    {
                        varr(i,j,k,n) = 0.0;
                    });
                }
                else if (type == FabType::singlevalued)
                {
                    AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                    {
                        mlndlap_mknewu_eb(i,j,k, varr, solarr, sigmaarr, vfracarr, intgarr, dxinv);
                    });
                }
                else
                {
                    regular = true;
                }
            }
            if (regular)
#endif
            {
                if (sigma) {
                    Array4<Real const> const& sigmaarr = sigma->const_array(mfi);
#if (AMREX_SPACEDIM == 2)
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                    {
                        mlndlap_mknewu(i,j,k,varr,solarr,sigmaarr,dxinv,is_rz);
                    });
#else
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                    {
                        mlndlap_mknewu(i,j,k,varr,solarr,sigmaarr,dxinv);
                    });
#endif
                } else {
                    Real const_sigma = m_const_sigma;
#if (AMREX_SPACEDIM == 2)
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                    {
                        mlndlap_mknewu_c(i,j,k,varr,solarr,const_sigma,dxinv,is_rz);
                    });
#else
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                    {
                        mlndlap_mknewu_c(i,j,k,varr,solarr,const_sigma,dxinv);
                    });
#endif
                }
            }
        }
    }
}